

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conn.cpp
# Opt level: O3

void __thiscall Conn::handle(Conn *this,epoll_event *cur_ev)

{
  uint uVar1;
  int iVar2;
  socklen_t client_sock_len;
  sockaddr_in client_sock_addr;
  socklen_t local_1c;
  sockaddr local_18;
  
  uVar1 = cur_ev->events;
  if ((uVar1 & 1) == 0) {
    if ((uVar1 & 4) == 0) {
      if ((uVar1 & 0x10) != 0) {
        handle((Conn *)cur_ev);
      }
    }
    else {
      handle();
    }
  }
  else if ((cur_ev->data).fd == this->_listen_fd) {
    local_1c = 0x10;
    iVar2 = accept((cur_ev->data).fd,&local_18,&local_1c);
    if (iVar2 < 0) {
      handle(_stderr);
    }
    else {
      handle();
    }
  }
  else {
    handle();
  }
  return;
}

Assistant:

void Conn::handle(struct epoll_event &cur_ev)
{
    if (cur_ev.events & EPOLLIN)
    {
        int cur_fd = cur_ev.data.fd;
        if (cur_fd != _listen_fd)   //sockfd
        {
            LOG_PRINT("epollin sockfd %d", cur_fd);
            ConnInfo *conn_info = get_conn(cur_fd);
            if (conn_info != nullptr)
            {
                int ret = do_recv(conn_info);
                if (ret == err_svr_recv_normal)
                {
                    //修改sockfd描述符事件，增加写事件
                    _epoll.modify_event(cur_fd, EPOLLOUT);
                }
                else if (ret == err_svr_recv_eof)
                {
                    if ((conn_info->buf).data_size() == 0)
                    {
                        del_conn(conn_info->fd);
                    }
                    else
                    {
                        //修改sockfd描述符事件，增加写事件
                        _epoll.modify_event(cur_fd, EPOLLOUT);
                    }
                }
                else if (ret == err_svr_recv_nospace)
                {
                    // Buff& buf = conn_info->buf;
                    // if (buf.data_size() > 0)
                    // {
                    //     //修改sockfd描述符事件，增加写事件
                    //     _epoll.modify_event(cur_fd, EPOLLOUT);
                    // }
                }
            }
            else
            {
                LOG_PRINT("Error: sockfd %d don't have conn info", cur_fd);
                return ;
            }  
        }
        else    //listen_fd
        {
            struct sockaddr_in client_sock_addr;
            socklen_t client_sock_len;
            client_sock_len = sizeof(struct sockaddr_in);
            int fd = accept(_listen_fd, (struct sockaddr *)&client_sock_addr, &client_sock_len);
            if (fd < 0)
            {
                LOG_PRINT("accept sock failed!");
                return ;
            }
            LOG_PRINT("accept fd %d, ip: %s port: %d", fd, inet_ntoa(client_sock_addr.sin_addr), ntohs(client_sock_addr.sin_port));
            add_conn(fd, client_sock_addr);

            int flags = fcntl(fd, F_GETFL, 0);
            fcntl(fd, F_SETFL, flags | O_NONBLOCK);
            _epoll.add_event(fd, EPOLLIN);
        }
    }
    else if (cur_ev.events & EPOLLOUT)
    {
        int cur_fd = cur_ev.data.fd;
        LOG_PRINT("epollout fd %d", cur_fd);
        ConnInfo *conn_info = get_conn(cur_fd);
        int ret = do_send(conn_info);
        if (ret == err_svr_send_disconn)
        {
            del_conn(cur_fd);
        }
        else if (ret == err_svr_send_normal)
        {
            _epoll.modify_event(cur_fd, EPOLLIN);
        }
        
    }
    else if (cur_ev.events & EPOLLHUP)
    {
        LOG_PRINT("epollhup fd %d", cur_ev.data.fd);
    }
}